

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  short sVar1;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  longlong lVar11;
  longlong lVar12;
  int6 iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  longlong lVar31;
  longlong lVar32;
  ushort uVar33;
  short sVar34;
  ushort uVar35;
  int iVar36;
  int iVar37;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  uint uVar38;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *array;
  int32_t in_R9D;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ushort uVar47;
  undefined1 auVar48 [16];
  __m128i alVar49;
  __m128i c;
  __m128i vH_00;
  __m128i a;
  int32_t in_stack_fffffffffffff868;
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  ushort local_62a;
  int16_t score;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvHMax;
  __m128i *pvH;
  __m128i *pvHt;
  __m128i *pvE;
  __m128i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_sse2_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_sse2_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_sse2_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    matrix._4_4_ = 0;
    s1Len = profile->s1Len;
    ppVar9 = profile->matrix;
    iVar36 = (s1Len + 7) / 8;
    pvVar10 = (profile->profile16).score;
    i._0_2_ = (short)open;
    uVar27 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar28 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (short)gap;
    uVar29 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    uVar30 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    if (ppVar9->min <= -open) {
      i._0_2_ = -(short)ppVar9->min;
    }
    uVar33 = (short)i + 0x8001;
    sVar34 = ((ushort)ppVar9->max ^ 0x7fff) - 1;
    lVar31 = CONCAT26(uVar33,CONCAT24(uVar33,CONCAT22(uVar33,uVar33)));
    lVar32 = CONCAT26(uVar33,CONCAT24(uVar33,CONCAT22(uVar33,uVar33)));
    vSaturationCheckMax[1] = CONCAT26(sVar34,CONCAT24(sVar34,CONCAT22(sVar34,sVar34)));
    vSaturationCheckMin[0] = CONCAT26(sVar34,CONCAT24(sVar34,CONCAT22(sVar34,sVar34)));
    uVar35 = -(short)iVar36 * (short)j;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = CONCAT62(0,uVar33);
    auVar39._8_8_ =
         CONCAT26(uVar35,CONCAT24(uVar35,CONCAT22(uVar35,uVar35))) << 0x10 | (ulong)uVar35;
    auVar39._0_8_ = CONCAT26(uVar35,CONCAT24(uVar35,CONCAT22(uVar35,uVar35))) << 0x10;
    auVar39 = paddsw(auVar40,auVar39);
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar36 * 8,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x8200404;
      uVar38 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar38;
      *(uint *)&profile_local->field_0xc = uVar38;
      b = parasail_memalign___m128i(0x10,(long)iVar36);
      ptr = parasail_memalign___m128i(0x10,(long)iVar36);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar36);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar36);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar36);
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar49[0] = (long)iVar36;
        alVar49[1] = extraout_RDX;
        parasail_memset___m128i(b_00,alVar49,len);
        c[0] = (long)iVar36;
        c[1] = extraout_RDX_00;
        array = b;
        parasail_memset___m128i(b,c,len);
        auVar48._8_8_ = uVar28;
        auVar48._0_8_ = uVar27;
        register0x00001200 = psubsw(ZEXT816(0),auVar48);
        end_query = iVar36;
        while (end_query = end_query + -1, -1 < end_query) {
          ptr_01[end_query][0] = vE[1];
          ptr_01[end_query][1] = vGapper[0];
          auVar24._8_8_ = uVar30;
          auVar24._0_8_ = uVar29;
          register0x00001200 = psubsw(stack0xfffffffffffff928,auVar24);
        }
        vNegInfFront[1] = lVar31;
        vMaxHUnit[0] = lVar32;
        vMaxHUnit[1] = lVar31;
        vMaxH[0] = lVar32;
        vMaxH[1] = lVar31;
        vSaturationCheckMax[0] = lVar32;
        local_62a = uVar33;
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          vH_00[0] = b_00[iVar36 + -1][0];
          vHp[0] = b_00[iVar36 + -1][1] << 0x10 | vH_00[0] >> 0x30;
          pvW = (__m128i *)(vH_00[0] << 0x10);
          vH_00[0] = (ulong)end_ref;
          iVar37 = ppVar9->mapper[(byte)s2[vH_00[0]]];
          vF[1] = 0;
          vHt[0] = 0;
          vF[0] = lVar32;
          vH[1] = lVar31;
          end_query = 0;
          while( true ) {
            local_1d8 = (short)vH[1];
            sStack_1d6 = vH[1]._2_2_;
            sStack_1d4 = vH[1]._4_2_;
            sStack_1d2 = vH[1]._6_2_;
            sStack_1d0 = (short)vH[2];
            sStack_1ce = vH[2]._2_2_;
            sStack_1cc = vH[2]._4_2_;
            sStack_1ca = vH[2]._6_2_;
            if (iVar36 <= end_query) break;
            alVar49 = b_00[end_query];
            auVar23._8_8_ = uVar30;
            auVar23._0_8_ = uVar29;
            auVar48 = psubsw((undefined1  [16])b[end_query],auVar23);
            auVar22._8_8_ = uVar28;
            auVar22._0_8_ = uVar27;
            auVar40 = psubsw((undefined1  [16])b_00[end_query],auVar22);
            local_1b8 = auVar48._0_2_;
            sStack_1b6 = auVar48._2_2_;
            sStack_1b4 = auVar48._4_2_;
            sStack_1b2 = auVar48._6_2_;
            sStack_1b0 = auVar48._8_2_;
            sStack_1ae = auVar48._10_2_;
            sStack_1ac = auVar48._12_2_;
            sStack_1aa = auVar48._14_2_;
            local_1c8 = auVar40._0_2_;
            sStack_1c6 = auVar40._2_2_;
            sStack_1c4 = auVar40._4_2_;
            sStack_1c2 = auVar40._6_2_;
            sStack_1c0 = auVar40._8_2_;
            sStack_1be = auVar40._10_2_;
            sStack_1bc = auVar40._12_2_;
            sStack_1ba = auVar40._14_2_;
            uVar35 = (ushort)(local_1b8 < local_1c8) * local_1c8 |
                     (ushort)(local_1b8 >= local_1c8) * local_1b8;
            uVar41 = (ushort)(sStack_1b6 < sStack_1c6) * sStack_1c6 |
                     (ushort)(sStack_1b6 >= sStack_1c6) * sStack_1b6;
            uVar42 = (ushort)(sStack_1b4 < sStack_1c4) * sStack_1c4 |
                     (ushort)(sStack_1b4 >= sStack_1c4) * sStack_1b4;
            uVar43 = (ushort)(sStack_1b2 < sStack_1c2) * sStack_1c2 |
                     (ushort)(sStack_1b2 >= sStack_1c2) * sStack_1b2;
            uVar44 = (ushort)(sStack_1b0 < sStack_1c0) * sStack_1c0 |
                     (ushort)(sStack_1b0 >= sStack_1c0) * sStack_1b0;
            uVar45 = (ushort)(sStack_1ae < sStack_1be) * sStack_1be |
                     (ushort)(sStack_1ae >= sStack_1be) * sStack_1ae;
            uVar46 = (ushort)(sStack_1ac < sStack_1bc) * sStack_1bc |
                     (ushort)(sStack_1ac >= sStack_1bc) * sStack_1ac;
            uVar47 = (ushort)(sStack_1aa < sStack_1ba) * sStack_1ba |
                     (ushort)(sStack_1aa >= sStack_1ba) * sStack_1aa;
            vHt[1] = CONCAT26(uVar43,CONCAT24(uVar42,CONCAT22(uVar41,uVar35)));
            vE[0] = CONCAT26(uVar47,CONCAT24(uVar46,CONCAT22(uVar45,uVar44)));
            auVar40 = paddsw((undefined1  [16])_pvW,
                             *(undefined1 (*) [16])
                              ((long)pvVar10 +
                              (long)end_query * 0x10 + (long)(iVar37 * iVar36) * 0x10));
            auVar18._8_8_ = vHt[0];
            auVar18._0_8_ = vF[1];
            auVar48 = paddsw(auVar18,(undefined1  [16])ptr_01[end_query]);
            local_1e8 = auVar48._0_2_;
            sStack_1e6 = auVar48._2_2_;
            sStack_1e4 = auVar48._4_2_;
            sStack_1e2 = auVar48._6_2_;
            sStack_1e0 = auVar48._8_2_;
            sStack_1de = auVar48._10_2_;
            sStack_1dc = auVar48._12_2_;
            sStack_1da = auVar48._14_2_;
            vH[1]._0_4_ = CONCAT22((ushort)(sStack_1d6 < sStack_1e6) * sStack_1e6 |
                                   (ushort)(sStack_1d6 >= sStack_1e6) * sStack_1d6,
                                   (ushort)(local_1d8 < local_1e8) * local_1e8 |
                                   (ushort)(local_1d8 >= local_1e8) * local_1d8);
            vH[1]._0_6_ = CONCAT24((ushort)(sStack_1d4 < sStack_1e4) * sStack_1e4 |
                                   (ushort)(sStack_1d4 >= sStack_1e4) * sStack_1d4,(undefined4)vH[1]
                                  );
            vH[1] = CONCAT26((ushort)(sStack_1d2 < sStack_1e2) * sStack_1e2 |
                             (ushort)(sStack_1d2 >= sStack_1e2) * sStack_1d2,(undefined6)vH[1]);
            vF[0]._0_2_ = (ushort)(sStack_1d0 < sStack_1e0) * sStack_1e0 |
                          (ushort)(sStack_1d0 >= sStack_1e0) * sStack_1d0;
            vF[0]._2_2_ = (ushort)(sStack_1ce < sStack_1de) * sStack_1de |
                          (ushort)(sStack_1ce >= sStack_1de) * sStack_1ce;
            vF[0]._4_2_ = (ushort)(sStack_1cc < sStack_1dc) * sStack_1dc |
                          (ushort)(sStack_1cc >= sStack_1dc) * sStack_1cc;
            vF[0]._6_2_ = (ushort)(sStack_1ca < sStack_1da) * sStack_1da |
                          (ushort)(sStack_1ca >= sStack_1da) * sStack_1ca;
            local_208 = auVar40._0_2_;
            sStack_206 = auVar40._2_2_;
            sStack_204 = auVar40._4_2_;
            sStack_202 = auVar40._6_2_;
            sStack_200 = auVar40._8_2_;
            sStack_1fe = auVar40._10_2_;
            sStack_1fc = auVar40._12_2_;
            sStack_1fa = auVar40._14_2_;
            vF[1] = CONCAT26((ushort)((short)uVar43 < sStack_202) * sStack_202 |
                             ((short)uVar43 >= sStack_202) * uVar43,
                             CONCAT24((ushort)((short)uVar42 < sStack_204) * sStack_204 |
                                      ((short)uVar42 >= sStack_204) * uVar42,
                                      CONCAT22((ushort)((short)uVar41 < sStack_206) * sStack_206 |
                                               ((short)uVar41 >= sStack_206) * uVar41,
                                               (ushort)((short)uVar35 < local_208) * local_208 |
                                               ((short)uVar35 >= local_208) * uVar35)));
            vHt[0] = CONCAT26((ushort)((short)uVar47 < sStack_1fa) * sStack_1fa |
                              ((short)uVar47 >= sStack_1fa) * uVar47,
                              CONCAT24((ushort)((short)uVar46 < sStack_1fc) * sStack_1fc |
                                       ((short)uVar46 >= sStack_1fc) * uVar46,
                                       CONCAT22((ushort)((short)uVar45 < sStack_1fe) * sStack_1fe |
                                                ((short)uVar45 >= sStack_1fe) * uVar45,
                                                (ushort)((short)uVar44 < sStack_200) * sStack_200 |
                                                ((short)uVar44 >= sStack_200) * uVar44)));
            b[end_query][0] = vHt[1];
            b[end_query][1] = vE[0];
            ptr[end_query][0] = vF[1];
            ptr[end_query][1] = vHt[0];
            end_query = end_query + 1;
            _pvW = alVar49;
          }
          auVar17._8_8_ = vHt[0] << 0x10 | (ulong)vF[1] >> 0x30;
          auVar17._0_8_ = vF[1] << 0x10;
          auVar40 = paddsw(auVar17,(undefined1  [16])*ptr_01);
          local_228 = auVar40._0_2_;
          sStack_226 = auVar40._2_2_;
          sStack_224 = auVar40._4_2_;
          sStack_222 = auVar40._6_2_;
          sStack_220 = auVar40._8_2_;
          sStack_21e = auVar40._10_2_;
          sStack_21c = auVar40._12_2_;
          sStack_21a = auVar40._14_2_;
          vH[1]._0_4_ = CONCAT22((ushort)(sStack_1d6 < sStack_226) * sStack_226 |
                                 (ushort)(sStack_1d6 >= sStack_226) * sStack_1d6,
                                 (ushort)(local_1d8 < local_228) * local_228 |
                                 (ushort)(local_1d8 >= local_228) * local_1d8);
          vH[1]._0_6_ = CONCAT24((ushort)(sStack_1d4 < sStack_224) * sStack_224 |
                                 (ushort)(sStack_1d4 >= sStack_224) * sStack_1d4,(undefined4)vH[1]);
          vH[1] = CONCAT26((ushort)(sStack_1d2 < sStack_222) * sStack_222 |
                           (ushort)(sStack_1d2 >= sStack_222) * sStack_1d2,(undefined6)vH[1]);
          vF[0]._0_2_ = (ushort)(sStack_1d0 < sStack_220) * sStack_220 |
                        (ushort)(sStack_1d0 >= sStack_220) * sStack_1d0;
          vF[0]._2_2_ = (ushort)(sStack_1ce < sStack_21e) * sStack_21e |
                        (ushort)(sStack_1ce >= sStack_21e) * sStack_1ce;
          vF[0]._4_2_ = (ushort)(sStack_1cc < sStack_21c) * sStack_21c |
                        (ushort)(sStack_1cc >= sStack_21c) * sStack_1cc;
          vF[0]._6_2_ = (ushort)(sStack_1ca < sStack_21a) * sStack_21a |
                        (ushort)(sStack_1ca >= sStack_21a) * sStack_1ca;
          end_query = 0;
          while( true ) {
            if (5 < end_query) break;
            auVar16._8_8_ = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar16._0_8_ = vH[1] << 0x10;
            auVar40 = paddsw(auVar16,auVar39);
            local_238 = (short)vH[1];
            sStack_236 = vH[1]._2_2_;
            sStack_234 = vH[1]._4_2_;
            sStack_232 = vH[1]._6_2_;
            sStack_230 = (short)vH[2];
            sStack_22e = vH[2]._2_2_;
            sStack_22c = vH[2]._4_2_;
            sStack_22a = vH[2]._6_2_;
            local_248 = auVar40._0_2_;
            sStack_246 = auVar40._2_2_;
            sStack_244 = auVar40._4_2_;
            sStack_242 = auVar40._6_2_;
            sStack_240 = auVar40._8_2_;
            sStack_23e = auVar40._10_2_;
            sStack_23c = auVar40._12_2_;
            sStack_23a = auVar40._14_2_;
            vH[1]._0_4_ = CONCAT22((ushort)(sStack_236 < sStack_246) * sStack_246 |
                                   (ushort)(sStack_236 >= sStack_246) * sStack_236,
                                   (ushort)(local_238 < local_248) * local_248 |
                                   (ushort)(local_238 >= local_248) * local_238);
            vH[1]._0_6_ = CONCAT24((ushort)(sStack_234 < sStack_244) * sStack_244 |
                                   (ushort)(sStack_234 >= sStack_244) * sStack_234,(undefined4)vH[1]
                                  );
            vH[1] = CONCAT26((ushort)(sStack_232 < sStack_242) * sStack_242 |
                             (ushort)(sStack_232 >= sStack_242) * sStack_232,(undefined6)vH[1]);
            vF[0]._0_2_ = (ushort)(sStack_230 < sStack_240) * sStack_240 |
                          (ushort)(sStack_230 >= sStack_240) * sStack_230;
            vF[0]._2_2_ = (ushort)(sStack_22e < sStack_23e) * sStack_23e |
                          (ushort)(sStack_22e >= sStack_23e) * sStack_22e;
            vF[0]._4_2_ = (ushort)(sStack_22c < sStack_23c) * sStack_23c |
                          (ushort)(sStack_22c >= sStack_23c) * sStack_22c;
            vF[0]._6_2_ = (ushort)(sStack_22a < sStack_23a) * sStack_23a |
                          (ushort)(sStack_22a >= sStack_23a) * sStack_22a;
            end_query = end_query + 1;
          }
          auVar15._8_8_ = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
          auVar15._0_8_ = vH[1] << 0x10;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = CONCAT62(0,uVar33);
          register0x00001200 = paddsw(auVar15,auVar14);
          sStack_256 = (short)vF[1];
          sStack_254 = (short)((ulong)vF[1] >> 0x10);
          sStack_252 = (short)((ulong)vF[1] >> 0x20);
          sStack_250 = (short)((ulong)vF[1] >> 0x30);
          sStack_24e = (short)vHt[0];
          sStack_24c = (short)((ulong)vHt[0] >> 0x10);
          sStack_24a = (short)((ulong)vHt[0] >> 0x20);
          local_268 = (short)vH[1];
          sStack_266 = vH[1]._2_2_;
          sStack_264 = vH[1]._4_2_;
          sStack_262 = vH[1]._6_2_;
          sStack_260 = (short)vH[2];
          sStack_25e = vH[2]._2_2_;
          sStack_25c = vH[2]._4_2_;
          sStack_25a = vH[2]._6_2_;
          local_268 = (ushort)(0 < local_268) * local_268;
          uVar35 = (ushort)(sStack_256 < sStack_266) * sStack_266 |
                   (ushort)(sStack_256 >= sStack_266) * sStack_256;
          uVar41 = (ushort)(sStack_254 < sStack_264) * sStack_264 |
                   (ushort)(sStack_254 >= sStack_264) * sStack_254;
          uVar42 = (ushort)(sStack_252 < sStack_262) * sStack_262 |
                   (ushort)(sStack_252 >= sStack_262) * sStack_252;
          uVar43 = (ushort)(sStack_250 < sStack_260) * sStack_260 |
                   (ushort)(sStack_250 >= sStack_260) * sStack_250;
          uVar44 = (ushort)(sStack_24e < sStack_25e) * sStack_25e |
                   (ushort)(sStack_24e >= sStack_25e) * sStack_24e;
          uVar45 = (ushort)(sStack_24c < sStack_25c) * sStack_25c |
                   (ushort)(sStack_24c >= sStack_25c) * sStack_24c;
          uVar46 = (ushort)(sStack_24a < sStack_25a) * sStack_25a |
                   (ushort)(sStack_24a >= sStack_25a) * sStack_24a;
          vHp[1]._0_4_ = CONCAT22((-1 < (short)uVar35) * uVar35,(ushort)(-1 < local_268) * local_268
                                 );
          vHp[1]._0_6_ = CONCAT24((-1 < (short)uVar41) * uVar41,(undefined4)vHp[1]);
          vHp[1] = CONCAT26((-1 < (short)uVar42) * uVar42,(undefined6)vHp[1]);
          vH[0]._0_4_ = CONCAT22((-1 < (short)uVar44) * uVar44,(-1 < (short)uVar43) * uVar43);
          vH[0]._0_6_ = CONCAT24((-1 < (short)uVar45) * uVar45,(undefined4)vH[0]);
          vH[0] = CONCAT26((-1 < (short)uVar46) * uVar46,(undefined6)vH[0]);
          end_query = 0;
          while( true ) {
            local_328 = (short)vMaxHUnit[1];
            sStack_326 = (short)((ulong)vMaxHUnit[1] >> 0x10);
            sStack_324 = (short)((ulong)vMaxHUnit[1] >> 0x20);
            sStack_322 = (short)((ulong)vMaxHUnit[1] >> 0x30);
            sStack_320 = (short)vMaxH[0];
            sStack_31e = (short)((ulong)vMaxH[0] >> 0x10);
            sStack_31c = (short)((ulong)vMaxH[0] >> 0x20);
            sStack_31a = (short)((ulong)vMaxH[0] >> 0x30);
            if (iVar36 <= end_query) break;
            lVar11 = ptr[end_query][0];
            lVar12 = ptr[end_query][1];
            auVar21._8_8_ = uVar30;
            auVar21._0_8_ = uVar29;
            auVar48 = psubsw(stack0xfffffffffffff8f8,auVar21);
            auVar20._8_8_ = vH[0];
            auVar20._0_8_ = vHp[1];
            auVar19._8_8_ = uVar28;
            auVar19._0_8_ = uVar27;
            auVar40 = psubsw(auVar20,auVar19);
            local_298 = auVar48._0_2_;
            sStack_296 = auVar48._2_2_;
            sStack_294 = auVar48._4_2_;
            sStack_292 = auVar48._6_2_;
            sStack_290 = auVar48._8_2_;
            sStack_28e = auVar48._10_2_;
            sStack_28c = auVar48._12_2_;
            sStack_28a = auVar48._14_2_;
            local_2a8 = auVar40._0_2_;
            sStack_2a6 = auVar40._2_2_;
            sStack_2a4 = auVar40._4_2_;
            sStack_2a2 = auVar40._6_2_;
            sStack_2a0 = auVar40._8_2_;
            sStack_29e = auVar40._10_2_;
            sStack_29c = auVar40._12_2_;
            sStack_29a = auVar40._14_2_;
            uVar35 = (ushort)(local_298 < local_2a8) * local_2a8 |
                     (ushort)(local_298 >= local_2a8) * local_298;
            uVar41 = (ushort)(sStack_296 < sStack_2a6) * sStack_2a6 |
                     (ushort)(sStack_296 >= sStack_2a6) * sStack_296;
            uVar42 = (ushort)(sStack_294 < sStack_2a4) * sStack_2a4 |
                     (ushort)(sStack_294 >= sStack_2a4) * sStack_294;
            uVar43 = (ushort)(sStack_292 < sStack_2a2) * sStack_2a2 |
                     (ushort)(sStack_292 >= sStack_2a2) * sStack_292;
            vF[0]._0_2_ = (ushort)(sStack_290 < sStack_2a0) * sStack_2a0 |
                          (ushort)(sStack_290 >= sStack_2a0) * sStack_290;
            vF[0]._2_2_ = (ushort)(sStack_28e < sStack_29e) * sStack_29e |
                          (ushort)(sStack_28e >= sStack_29e) * sStack_28e;
            vF[0]._4_2_ = (ushort)(sStack_28c < sStack_29c) * sStack_29c |
                          (ushort)(sStack_28c >= sStack_29c) * sStack_28c;
            vF[0]._6_2_ = (ushort)(sStack_28a < sStack_29a) * sStack_29a |
                          (ushort)(sStack_28a >= sStack_29a) * sStack_28a;
            vH[1]._0_4_ = CONCAT22(uVar41,uVar35);
            vH[1]._0_6_ = CONCAT24(uVar42,(undefined4)vH[1]);
            vH[1] = CONCAT26(uVar43,(undefined6)vH[1]);
            local_2b8 = (short)lVar11;
            sStack_2b6 = (short)((ulong)lVar11 >> 0x10);
            sStack_2b4 = (short)((ulong)lVar11 >> 0x20);
            sStack_2b2 = (short)((ulong)lVar11 >> 0x30);
            sStack_2b0 = (short)lVar12;
            sStack_2ae = (short)((ulong)lVar12 >> 0x10);
            sStack_2ac = (short)((ulong)lVar12 >> 0x20);
            sStack_2aa = (short)((ulong)lVar12 >> 0x30);
            uVar35 = (local_2b8 < (short)uVar35) * uVar35 |
                     (ushort)(local_2b8 >= (short)uVar35) * local_2b8;
            uVar41 = (sStack_2b6 < (short)uVar41) * uVar41 |
                     (ushort)(sStack_2b6 >= (short)uVar41) * sStack_2b6;
            uVar42 = (sStack_2b4 < (short)uVar42) * uVar42 |
                     (ushort)(sStack_2b4 >= (short)uVar42) * sStack_2b4;
            uVar43 = (sStack_2b2 < (short)uVar43) * uVar43 |
                     (ushort)(sStack_2b2 >= (short)uVar43) * sStack_2b2;
            uVar44 = (sStack_2b0 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                     (ushort)(sStack_2b0 >= (short)(ushort)vF[0]) * sStack_2b0;
            uVar45 = (sStack_2ae < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                     (ushort)(sStack_2ae >= (short)vF[0]._2_2_) * sStack_2ae;
            uVar46 = (sStack_2ac < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                     (ushort)(sStack_2ac >= (short)vF[0]._4_2_) * sStack_2ac;
            uVar47 = (sStack_2aa < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                     (ushort)(sStack_2aa >= (short)vF[0]._6_2_) * sStack_2aa;
            sVar1 = (-1 < (short)uVar35) * uVar35;
            sVar2 = (-1 < (short)uVar41) * uVar41;
            sVar3 = (-1 < (short)uVar42) * uVar42;
            sVar4 = (-1 < (short)uVar43) * uVar43;
            sVar5 = (-1 < (short)uVar44) * uVar44;
            sVar6 = (-1 < (short)uVar45) * uVar45;
            sVar7 = (-1 < (short)uVar46) * uVar46;
            sVar8 = (-1 < (short)uVar47) * uVar47;
            vHp[1]._0_4_ = CONCAT22(sVar2,sVar1);
            vHp[1]._0_6_ = CONCAT24(sVar3,(undefined4)vHp[1]);
            vHp[1] = CONCAT26(sVar4,(undefined6)vHp[1]);
            vH[0]._0_4_ = CONCAT22(sVar6,sVar5);
            vH[0]._0_6_ = CONCAT24(sVar7,(undefined4)vH[0]);
            vH[0] = CONCAT26(sVar8,(undefined6)vH[0]);
            b_00[end_query][0] = vHp[1];
            b_00[end_query][1] = vH[0];
            local_198 = (short)vSaturationCheckMax[1];
            sStack_196 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_194 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_192 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_190 = (short)vSaturationCheckMin[0];
            sStack_18e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_18c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_18a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1] =
                 CONCAT26((ushort)(sVar4 < sStack_192) * sVar4 |
                          (ushort)(sVar4 >= sStack_192) * sStack_192,
                          CONCAT24((ushort)(sVar3 < sStack_194) * sVar3 |
                                   (ushort)(sVar3 >= sStack_194) * sStack_194,
                                   CONCAT22((ushort)(sVar2 < sStack_196) * sVar2 |
                                            (ushort)(sVar2 >= sStack_196) * sStack_196,
                                            (ushort)(sVar1 < local_198) * sVar1 |
                                            (ushort)(sVar1 >= local_198) * local_198)));
            vSaturationCheckMin[0] =
                 CONCAT26((ushort)(sVar8 < sStack_18a) * sVar8 |
                          (ushort)(sVar8 >= sStack_18a) * sStack_18a,
                          CONCAT24((ushort)(sVar7 < sStack_18c) * sVar7 |
                                   (ushort)(sVar7 >= sStack_18c) * sStack_18c,
                                   CONCAT22((ushort)(sVar6 < sStack_18e) * sVar6 |
                                            (ushort)(sVar6 >= sStack_18e) * sStack_18e,
                                            (ushort)(sVar5 < sStack_190) * sVar5 |
                                            (ushort)(sVar5 >= sStack_190) * sStack_190)));
            local_2f8 = (short)vMaxH[1];
            sStack_2f6 = (short)((ulong)vMaxH[1] >> 0x10);
            sStack_2f4 = (short)((ulong)vMaxH[1] >> 0x20);
            sStack_2f2 = (short)((ulong)vMaxH[1] >> 0x30);
            sStack_2f0 = (short)vSaturationCheckMax[0];
            sStack_2ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_2ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_2ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            vMaxH[1] = CONCAT26((ushort)(sStack_2f2 < sVar4) * sVar4 |
                                (ushort)(sStack_2f2 >= sVar4) * sStack_2f2,
                                CONCAT24((ushort)(sStack_2f4 < sVar3) * sVar3 |
                                         (ushort)(sStack_2f4 >= sVar3) * sStack_2f4,
                                         CONCAT22((ushort)(sStack_2f6 < sVar2) * sVar2 |
                                                  (ushort)(sStack_2f6 >= sVar2) * sStack_2f6,
                                                  (ushort)(local_2f8 < sVar1) * sVar1 |
                                                  (ushort)(local_2f8 >= sVar1) * local_2f8)));
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)(sStack_2ea < sVar8) * sVar8 |
                          (ushort)(sStack_2ea >= sVar8) * sStack_2ea,
                          CONCAT24((ushort)(sStack_2ec < sVar7) * sVar7 |
                                   (ushort)(sStack_2ec >= sVar7) * sStack_2ec,
                                   CONCAT22((ushort)(sStack_2ee < sVar6) * sVar6 |
                                            (ushort)(sStack_2ee >= sVar6) * sStack_2ee,
                                            (ushort)(sStack_2f0 < sVar5) * sVar5 |
                                            (ushort)(sStack_2f0 >= sVar5) * sStack_2f0)));
            array = (__m128i *)
                    ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                    rowcols->score_row;
            vH_00[0] = (ulong)(uint)end_query;
            vH_00[1]._0_4_ = iVar36;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_00,end_ref,s2Len,in_R9D,in_stack_fffffffffffff868);
            vMaxHUnit[1] = CONCAT26((ushort)(sVar4 < sStack_322) * sStack_322 |
                                    (ushort)(sVar4 >= sStack_322) * sVar4,
                                    CONCAT24((ushort)(sVar3 < sStack_324) * sStack_324 |
                                             (ushort)(sVar3 >= sStack_324) * sVar3,
                                             CONCAT22((ushort)(sVar2 < sStack_326) * sStack_326 |
                                                      (ushort)(sVar2 >= sStack_326) * sVar2,
                                                      (ushort)(sVar1 < local_328) * local_328 |
                                                      (ushort)(sVar1 >= local_328) * sVar1)));
            vMaxH[0] = CONCAT26((ushort)(sVar8 < sStack_31a) * sStack_31a |
                                (ushort)(sVar8 >= sStack_31a) * sVar8,
                                CONCAT24((ushort)(sVar7 < sStack_31c) * sStack_31c |
                                         (ushort)(sVar7 >= sStack_31c) * sVar7,
                                         CONCAT22((ushort)(sVar6 < sStack_31e) * sStack_31e |
                                                  (ushort)(sVar6 >= sStack_31e) * sVar6,
                                                  (ushort)(sVar5 < sStack_320) * sStack_320 |
                                                  (ushort)(sVar5 >= sStack_320) * sVar5)));
            end_query = end_query + 1;
          }
          local_168 = (short)vNegInfFront[1];
          sStack_166 = (short)((ulong)vNegInfFront[1] >> 0x10);
          sStack_164 = (short)((ulong)vNegInfFront[1] >> 0x20);
          sStack_162 = (short)((ulong)vNegInfFront[1] >> 0x30);
          sStack_160 = (short)vMaxHUnit[0];
          sStack_15e = (short)((ulong)vMaxHUnit[0] >> 0x10);
          sStack_15c = (short)((ulong)vMaxHUnit[0] >> 0x20);
          sStack_15a = (short)((ulong)vMaxHUnit[0] >> 0x30);
          uVar35 = -(ushort)(sStack_160 < sStack_320);
          uVar41 = -(ushort)(sStack_15e < sStack_31e);
          uVar42 = -(ushort)(sStack_15a < sStack_31a);
          auVar26._2_2_ = -(ushort)(sStack_166 < sStack_326);
          auVar26._0_2_ = -(ushort)(local_168 < local_328);
          auVar26._4_2_ = -(ushort)(sStack_164 < sStack_324);
          auVar26._6_2_ = -(ushort)(sStack_162 < sStack_322);
          iVar13 = CONCAT24(-(ushort)(sStack_15c < sStack_31c),CONCAT22(uVar41,uVar35));
          auVar26._14_2_ = uVar42;
          auVar26._8_6_ = iVar13;
          if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar35 & 0x80) != 0) || (uVar35 & 0x8000) != 0) || (uVar41 & 0x80) != 0) ||
                 (uVar41 & 0x8000) != 0) || (-(ushort)(sStack_15c < sStack_31c) & 0x80) != 0) ||
               iVar13 != 0) || (uVar42 >> 7 & 1) != 0) || sStack_15a < sStack_31a) {
            a[1] = vH_00[0];
            a[0] = (longlong)array;
            local_62a = _mm_hmax_epi16_rpl(a);
            vNegInfFront[1] = CONCAT26(local_62a,CONCAT24(local_62a,CONCAT22(local_62a,local_62a)));
            vMaxHUnit[0] = CONCAT26(local_62a,CONCAT24(local_62a,CONCAT22(local_62a,local_62a)));
            matrix._4_4_ = end_ref;
            array = ptr_00;
            memcpy(ptr_00,b_00,(long)iVar36 << 4);
          }
        }
        _temp = ptr_00;
        for (end_query = 0; end_query < iVar36 * 8; end_query = end_query + 1) {
          if (((ushort)(*_temp)[0] == local_62a) &&
             (iVar37 = end_query / 8 + (end_query % 8) * iVar36, iVar37 < s1Len)) {
            s1Len = iVar37;
          }
          _temp = (__m128i *)((long)*_temp + 2);
        }
        local_e8 = (short)vSaturationCheckMax[1];
        sStack_e6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_e4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_e2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_e0 = (short)vSaturationCheckMin[0];
        sStack_de = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_dc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_da = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_178 = (short)vMaxH[1];
        sStack_176 = (short)((ulong)vMaxH[1] >> 0x10);
        sStack_174 = (short)((ulong)vMaxH[1] >> 0x20);
        sStack_172 = (short)((ulong)vMaxH[1] >> 0x30);
        sStack_170 = (short)vSaturationCheckMax[0];
        sStack_16e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_16c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_16a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        vH_00[0] = CONCAT26(-(ushort)(sStack_da < (short)uVar33),
                            CONCAT24(-(ushort)(sStack_dc < (short)uVar33),
                                     CONCAT22(-(ushort)(sStack_de < (short)uVar33),
                                              -(ushort)(sStack_e0 < (short)uVar33)))) |
                   CONCAT26(-(ushort)(sVar34 < sStack_16a),
                            CONCAT24(-(ushort)(sVar34 < sStack_16c),
                                     CONCAT22(-(ushort)(sVar34 < sStack_16e),
                                              -(ushort)(sVar34 < sStack_170))));
        auVar25._8_8_ = vH_00[0];
        auVar25._0_8_ =
             CONCAT26(-(ushort)(sStack_e2 < (short)uVar33),
                      CONCAT24(-(ushort)(sStack_e4 < (short)uVar33),
                               CONCAT22(-(ushort)(sStack_e6 < (short)uVar33),
                                        -(ushort)(local_e8 < (short)uVar33)))) |
             CONCAT26(-(ushort)(sVar34 < sStack_172),
                      CONCAT24(-(ushort)(sVar34 < sStack_174),
                               CONCAT22(-(ushort)(sVar34 < sStack_176),-(ushort)(sVar34 < local_178)
                                       )));
        if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (vH_00[0] >> 7 & 1) != 0) || (vH_00[0] >> 0xf & 1) != 0) ||
                (vH_00[0] >> 0x17 & 1) != 0) || (vH_00[0] >> 0x1f & 1) != 0) ||
              (vH_00[0] >> 0x27 & 1) != 0) || (vH_00[0] >> 0x2f & 1) != 0) ||
            (vH_00[0] >> 0x37 & 1) != 0) || (long)vH_00[0] < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_62a = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)(short)local_62a;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = matrix._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_00);
        parasail_free(ptr);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}